

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ApiCallback(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long *plVar1;
  i64 iVar2;
  char *z;
  long lVar3;
  
  plVar1 = (long *)context->pFunc->pUserData;
  iVar2 = sqlite3VdbeIntValue(*argv);
  for (lVar3 = *(long *)(*plVar1 + 0x48); (lVar3 != 0 && (*(long *)(lVar3 + 0x18) != iVar2));
      lVar3 = *(long *)(lVar3 + 8)) {
  }
  if (lVar3 != 0) {
    *(long **)(lVar3 + 0x90) = plVar1;
    (*(code *)plVar1[3])(&sFts5Api,lVar3,context,argc + -1,argv + 1);
    *(undefined8 *)(lVar3 + 0x90) = 0;
    return;
  }
  z = sqlite3_mprintf("no such cursor: %lld",iVar2);
  context->isError = 1;
  sqlite3VdbeMemSetStr(context->pOut,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3_free(z);
  return;
}

Assistant:

static void fts5ApiCallback(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){

  Fts5Auxiliary *pAux;
  Fts5Cursor *pCsr;
  i64 iCsrId;

  assert( argc>=1 );
  pAux = (Fts5Auxiliary*)sqlite3_user_data(context);
  iCsrId = sqlite3_value_int64(argv[0]);

  pCsr = fts5CursorFromCsrid(pAux->pGlobal, iCsrId);
  if( pCsr==0 ){
    char *zErr = sqlite3_mprintf("no such cursor: %lld", iCsrId);
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
  }else{
    fts5ApiInvoke(pAux, pCsr, context, argc-1, &argv[1]);
  }
}